

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O2

bool CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_Parse
               (ConstStringParam name,AudioFeaturePrint_Sound_SoundVersion *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)AudioFeaturePrint_Sound_SoundVersion_entries,2,local_20,&int_value
                    );
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool AudioFeaturePrint_Sound_SoundVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, AudioFeaturePrint_Sound_SoundVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      AudioFeaturePrint_Sound_SoundVersion_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<AudioFeaturePrint_Sound_SoundVersion>(int_value);
  }
  return success;
}